

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int archive_compressor_xz_write(archive_write_filter *f,void *buff,size_t length)

{
  private_data_conflict8 *data_00;
  uint32_t uVar1;
  int ret;
  private_data_conflict8 *data;
  size_t length_local;
  void *buff_local;
  archive_write_filter *f_local;
  
  data_00 = (private_data_conflict8 *)f->data;
  data_00->total_in = length + data_00->total_in;
  if (f->code == 9) {
    uVar1 = lzma_crc32(buff,length,data_00->crc32);
    data_00->crc32 = uVar1;
  }
  (data_00->stream).next_in = (uint8_t *)buff;
  (data_00->stream).avail_in = length;
  f_local._4_4_ = drive_compressor(f,data_00,0);
  if (f_local._4_4_ == 0) {
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_xz_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	/* Update statistics */
	data->total_in += length;
	if (f->code == ARCHIVE_FILTER_LZIP)
		data->crc32 = lzma_crc32(buff, length, data->crc32);

	/* Compress input data to output buffer */
	data->stream.next_in = buff;
	data->stream.avail_in = length;
	if ((ret = drive_compressor(f, data, 0)) != ARCHIVE_OK)
		return (ret);

	return (ARCHIVE_OK);
}